

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBMPC.cpp
# Opt level: O3

int GetUnformatSizeCode(DataRate datarate)

{
  if ((int)datarate < 500000) {
    if ((datarate == _250K) || (datarate == _300K)) {
      return 6;
    }
  }
  else if (datarate == _1M) {
    return 8;
  }
  return 7;
}

Assistant:

int GetUnformatSizeCode(DataRate datarate)
{
    switch (datarate)
    {
    case DataRate::_250K:   return 6;
    case DataRate::_300K:   return 6;
    case DataRate::_500K:   return 7;
    case DataRate::_1M:     return 8;
    default:                break;
    }

    return 7;
}